

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void SVGChart::MakeExamplePlot3(PPlot *ioPPlot)

{
  PlotData *pPVar1;
  PColor local_33;
  float local_30;
  float local_2c;
  int local_28;
  float local_24;
  int theI;
  float theFac;
  PlotData *theY1;
  PlotData *theX1;
  PPlot *ioPPlot_local;
  
  theX1 = (PlotData *)ioPPlot;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  theY1 = pPVar1;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  local_24 = 1e-06;
  _theI = pPVar1;
  for (local_28 = 0; local_28 < 0x65; local_28 = local_28 + 1) {
    local_2c = (float)local_28;
    std::vector<float,_std::allocator<float>_>::push_back(&theY1->super_RealPlotData,&local_2c);
    local_30 = local_24 * (float)local_28 * (float)local_28 * (float)local_28;
    std::vector<float,_std::allocator<float>_>::push_back(&_theI->super_RealPlotData,&local_30);
  }
  PlotDataContainer::AddXYPlot
            ((PlotDataContainer *)&theX1->super_RealPlotData,(PlotDataBase *)0x0,
             &_theI->super_PlotDataBase,(LegendData *)0x0,(DataDrawerBase *)0x0,
             (PlotDataSelection *)0x0);
  std::__cxx11::string::operator=
            ((string *)
             &theX1[0x1d].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_finish,"narrow margins");
  *(undefined1 *)
   &theX1[0x1d].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  PColor::PColor(&local_33,200,200,200);
  *(undefined2 *)
   ((long)&theX1[0x1d].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = local_33._0_2_;
  *(uchar *)((long)&theX1[0x1d].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3) = local_33.mB;
  theX1[0x1c].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x14;
  theX1[0x1c].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xa;
  theX1[0x1c].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xa;
  theX1[0x1d].super_PlotDataBase._vptr_PlotDataBase = (_func_int **)0xa;
  return;
}

Assistant:

void MakeExamplePlot3 (PPlot &ioPPlot) {

      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 1.0f/(100*100*100);
      for (int theI=0;theI<=100;theI++) {
        //    theX1->push_back (theI*0.001);
        theX1->push_back (theI);
        theY1->push_back (theFac*theI*theI*theI);
      }
      ioPPlot.mPlotDataContainer.AddXYPlot (nullptr, theY1, nullptr);

      ioPPlot.mPlotBackground.mTitle = "narrow margins";
      ioPPlot.mPlotBackground.mTransparent = false;
      ioPPlot.mPlotBackground.mPlotRegionBackColor = PColor (200,200,200);
      ioPPlot.mMargins.mTop = 20;
      ioPPlot.mMargins.mRight = 10;
      ioPPlot.mMargins.mLeft = 10;
      ioPPlot.mMargins.mBottom = 10;
    }